

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O2

double chiinv(double p,int df)

{
  char *__format;
  double dVar1;
  
  if (df < 1) {
    __format = "Degree of freedom is a real positive integer";
  }
  else {
    if ((0.0 <= p) && (p <= 1.0)) {
      dVar1 = gammainv(p,(double)df * 0.5,2.0);
      return dVar1;
    }
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  printf(__format);
  exit(1);
}

Assistant:

double chiinv(double p, int df) {
	double x,k;
	
	if (df <= 0 ) {
		printf("Degree of freedom is a real positive integer");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	k = (double) df;
	
	x = gammainv(p,k/2.,2.0);
	
	return x;
}